

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
mxx::allgatherv<int>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,int *data,size_t size,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,comm *comm)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *size_00;
  size_t data_00;
  int iVar1;
  reference out;
  allocator<int> local_4a;
  undefined1 local_49;
  unsigned_long *local_48;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_40;
  size_type_conflict local_38;
  size_t total_size;
  comm *comm_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes_local;
  size_t size_local;
  int *data_local;
  vector<int,_std::allocator<int>_> *result;
  
  total_size = (size_t)comm;
  comm_local = (comm *)recv_sizes;
  recv_sizes_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)size;
  size_local = (size_t)data;
  data_local = (int *)__return_storage_ptr__;
  local_40._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(recv_sizes);
  local_48 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)comm_local);
  iVar1 = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
                    (local_40,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               )local_48,0);
  local_49 = 0;
  local_38 = (long)iVar1;
  std::allocator<int>::allocator(&local_4a);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,(long)iVar1,&local_4a);
  std::allocator<int>::~allocator(&local_4a);
  data_00 = size_local;
  size_00 = recv_sizes_local;
  out = std::vector<int,_std::allocator<int>_>::operator[](__return_storage_ptr__,0);
  allgatherv<int>((int *)data_00,(size_t)size_00,out,
                  (vector<unsigned_long,_std::allocator<unsigned_long>_> *)comm_local,
                  (comm *)total_size);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> allgatherv(const T* data, size_t size, const std::vector<size_t>& recv_sizes, const mxx::comm& comm = mxx::comm()) {
    size_t total_size = std::accumulate(recv_sizes.begin(), recv_sizes.end(), 0);
    std::vector<T> result(total_size);
    allgatherv(data, size, &result[0], recv_sizes, comm);
    return result;
}